

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O2

void setTransformation(Transformation *t)

{
  double dVar1;
  
  if (t->enable == true) {
    std::vector<double,_std::allocator<double>_>::resize(&t->mat,4);
    dVar1 = (pi / 180.0) * t->rot;
    t->rot = dVar1;
    dVar1 = cos(dVar1);
    *(t->mat).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start = dVar1;
    dVar1 = sin(t->rot);
    (t->mat).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[1] = -dVar1;
    dVar1 = sin(t->rot);
    (t->mat).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[2] = dVar1;
    dVar1 = cos(t->rot);
    (t->mat).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[3] = dVar1;
    mkdir((t->outdir)._M_dataplus._M_p,0x1ff);
    return;
  }
  return;
}

Assistant:

void setTransformation(Transformation& t)
{
	if (t.enable)
	{
		t.mat.resize(4);

		// Get rotation matrix
		t.rot *= pi / 180.0;  // degrees to radians
		t.mat[0] =  std::cos(t.rot);
		t.mat[1] = -std::sin(t.rot);
		t.mat[2] =  std::sin(t.rot);
		t.mat[3] =  std::cos(t.rot);

		// Make output directory
		#if defined(_WIN32) || defined(_WIN64)
			_mkdir(t.outdir.c_str());
		#else
			mkdir(t.outdir.c_str(), 0777);
		#endif
	}
}